

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_spawn(Executor *this,size_t N)

{
  reference pvVar1;
  reference pvVar2;
  thread *in_RSI;
  Executor *in_RDI;
  size_t id;
  thread *in_stack_ffffffffffffffa8;
  thread *this_00;
  thread *in_stack_ffffffffffffffe0;
  thread *local_18;
  
  for (local_18 = (thread *)0x0; local_18 < in_RSI;
      local_18 = (thread *)((long)&(local_18->_M_id)._M_thread + 1)) {
    this_00 = local_18;
    pvVar1 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (&in_RDI->_workers,(size_type)local_18);
    pvVar1->_id = (size_t)this_00;
    pvVar1 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (&in_RDI->_workers,(size_type)local_18);
    pvVar1->_vtm = (size_t)local_18;
    pvVar1 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (&in_RDI->_workers,(size_type)local_18);
    pvVar1->_executor = in_RDI;
    pvVar2 = std::
             vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
             ::operator[](&(in_RDI->_notifier)._waiters,(size_type)local_18);
    pvVar1 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                       (&in_RDI->_workers,(size_type)local_18);
    pvVar1->_waiter = pvVar2;
    std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
              (&in_RDI->_workers,(size_type)local_18);
    std::thread::thread<tf::Executor::_spawn(unsigned_long)::_lambda()_1_,,void>
              (in_stack_ffffffffffffffe0,(type *)in_RDI);
    std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
              (&in_RDI->_workers,(size_type)local_18);
    std::thread::operator=(this_00,in_stack_ffffffffffffffa8);
    std::thread::~thread((thread *)0x11240e);
  }
  return;
}

Assistant:

inline void Executor::_spawn(size_t N) {

  for(size_t id=0; id<N; ++id) {

    _workers[id]._id = id;
    _workers[id]._vtm = id;
    _workers[id]._executor = this;
    _workers[id]._waiter = &_notifier._waiters[id];
    _workers[id]._thread = std::thread([&, &w=_workers[id]] () {

      pt::this_worker = &w;

      // initialize the random engine and seed for work-stealing loop
      w._rdgen.seed(static_cast<std::default_random_engine::result_type>(
        std::hash<std::thread::id>()(std::this_thread::get_id()))
      );

      // before entering the work-stealing loop, call the scheduler prologue
      if(_worker_interface) {
        _worker_interface->scheduler_prologue(w);
      }

      Node* t = nullptr;
      std::exception_ptr ptr = nullptr;

      // must use 1 as condition instead of !done because
      // the previous worker may stop while the following workers
      // are still preparing for entering the scheduling loop
      try {

        // worker loop
        while(1) {

          // drain out the local queue
          _exploit_task(w, t);

          // steal and wait for tasks
          if(_wait_for_task(w, t) == false) {
            break;
          }
        }
      } 
      catch(...) {
        ptr = std::current_exception();
      }
      
      // call the user-specified epilogue function
      if(_worker_interface) {
        _worker_interface->scheduler_epilogue(w, ptr);
      }

    });
  } 
}